

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

void __thiscall
SQCompilation::CodegenVisitor::EmitLoadConstFloat
          (CodegenVisitor *this,SQFloat value,SQInteger target)

{
  SQFuncState *in_RSI;
  SQInteger in_RDI;
  undefined4 in_XMM0_Da;
  SQInteger unaff_retaddr;
  SQOpcode in_stack_0000000c;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((long)in_RSI < 0) {
    in_RSI = (SQFuncState *)SQFuncState::PushTarget(in_RSI,in_RDI);
  }
  SQFuncState::AddInstruction
            ((SQFuncState *)target,in_stack_0000000c,unaff_retaddr,in_RDI,
             CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0),(SQInteger)in_RSI);
  return;
}

Assistant:

void CodegenVisitor::EmitLoadConstFloat(SQFloat value, SQInteger target)
{
    if (target < 0) {
        target = _fs->PushTarget();
    }
    if (sizeof(SQFloat) == sizeof(SQInt32)) {
        _fs->AddInstruction(_OP_LOADFLOAT, target, *((SQInt32 *)&value));
    }
    else {
        _fs->AddInstruction(_OP_LOAD, target, _fs->GetNumericConstant(value));
    }
}